

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitAtomicNotify(PrintExpressionContents *this,AtomicNotify *curr)

{
  address64_t aVar1;
  ostream *poVar2;
  Module *in_R8;
  Name name;
  string_view local_28;
  AtomicNotify *local_18;
  AtomicNotify *curr_local;
  PrintExpressionContents *this_local;
  
  poVar2 = this->o;
  local_18 = curr;
  curr_local = (AtomicNotify *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"memory.atomic.notify");
  printMedium(poVar2,local_28);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(local_18->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(local_18->memory).super_IString.str._M_len,name,
             (ostream *)this->wasm,in_R8);
  aVar1 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
  if (aVar1 != 0) {
    poVar2 = std::operator<<(this->o," offset=");
    aVar1 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
    std::ostream::operator<<(poVar2,aVar1);
  }
  return;
}

Assistant:

void visitAtomicNotify(AtomicNotify* curr) {
    printMedium(o, "memory.atomic.notify");
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }